

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_json.c
# Opt level: O0

_Bool JSON_stringify(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_class_t *pgVar1;
  gravity_object_t *pgVar2;
  gravity_value_t value_00;
  gravity_value_t value_01;
  uint32_t uVar3;
  ulong uVar4;
  char *pcVar5;
  gravity_string_t *pgVar6;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar7;
  gravity_value_t gVar8;
  gravity_string_t *s;
  char *buffer;
  char *jbuffer;
  size_t len;
  json_t *json;
  char **local_12a0;
  char *v;
  char vbuffer [512];
  char *vbuffer2_1;
  char local_1068 [8];
  char vbuffer2 [4096];
  size_t vlen;
  char *v_1;
  int nchars;
  gravity_value_t value;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  if (nargs < 2) {
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,rindex);
  }
  else {
    pgVar1 = args[1].isa;
    pgVar2 = args[1].field_1.p;
    gVar8 = args[1];
    if (pgVar1 == gravity_class_string) {
      uVar4 = (ulong)*(uint *)((long)&pgVar2->identifier + 4);
      if (uVar4 < 0xffb) {
        uVar3 = snprintf(local_1068,0x1000,"\"%s\"",pgVar2->objclass);
        gVar8 = gravity_string_to_value(vm,local_1068,uVar3);
        gravity_vm_setslot(vm,gVar8,rindex);
      }
      else {
        pcVar5 = (char *)gravity_calloc((gravity_vm *)0x0,1,uVar4 + 5);
        uVar3 = snprintf(pcVar5,uVar4 + 5,"\"%s\"");
        pgVar6 = gravity_string_new(vm,pcVar5,uVar3,0);
        pgVar1 = pgVar6->isa;
        aVar7.p = (gravity_object_t *)gravity_string_new(vm,pcVar5,uVar3,0);
        value_00.field_1.p = (gravity_object_t *)aVar7.n;
        value_00.isa = pgVar1;
        gravity_vm_setslot(vm,value_00,rindex);
      }
    }
    else {
      local_12a0 = (char **)0x0;
      if (((pgVar1 == gravity_class_null) && (pgVar2 == (gravity_object_t *)0x0)) ||
         ((pgVar1 == gravity_class_null && (pgVar2 == (gravity_object_t *)0x1)))) {
        local_12a0 = (char **)0x172300;
      }
      else if (pgVar1 == gravity_class_float) {
        snprintf((char *)&v,0x200,"%f",pgVar2);
        local_12a0 = &v;
      }
      else if (pgVar1 == gravity_class_bool) {
        local_12a0 = (char **)0x17226e;
        if (pgVar2 != (gravity_object_t *)0x0) {
          local_12a0 = (char **)0x172269;
        }
      }
      else if (pgVar1 == gravity_class_int) {
        snprintf((char *)&v,0x200,"%ld",pgVar2);
        local_12a0 = &v;
      }
      if (local_12a0 == (char **)0x0) {
        len = (size_t)json_new();
        json_set_option((json_t *)len,json_opt_no_maptype);
        json_set_option((json_t *)len,json_opt_no_undef);
        json_set_option((json_t *)len,json_opt_prettify);
        gravity_value_serialize((char *)0x0,gVar8,(json_t *)len);
        jbuffer = (char *)0x0;
        pcVar5 = json_buffer((json_t *)len,(size_t *)&jbuffer);
        pcVar5 = string_ndup(pcVar5,(size_t)jbuffer);
        aVar7.p = (gravity_object_t *)gravity_string_new(vm,pcVar5,(uint32_t)jbuffer,0);
        json_free((json_t *)len);
        gVar8.field_1.p = (gravity_object_t *)aVar7.n;
        gVar8.isa = (aVar7.p)->isa;
        gravity_vm_setslot(vm,gVar8,rindex);
      }
      else {
        _json = gravity_string_to_value(vm,(char *)local_12a0,0xffffffff);
        gravity_vm_setslot(vm,_json,rindex);
      }
    }
  }
  return true;
}

Assistant:

static bool JSON_stringify (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_VALUE(VALUE_FROM_NULL, rindex);
    
    // extract value
    gravity_value_t value = GET_VALUE(1);
    
    // special case for string because it can be huge (and must be quoted)
    if (VALUE_ISA_STRING(value)) {
        const int nchars = 5;
        const char *v = VALUE_AS_STRING(value)->s;
        size_t vlen = VALUE_AS_STRING(value)->len;

        // string must be quoted
        if (vlen < 4096-nchars) {
            char vbuffer2[4096];
            vlen = snprintf(vbuffer2, sizeof(vbuffer2), "\"%s\"", v);
            RETURN_VALUE(VALUE_FROM_STRING(vm, vbuffer2, (uint32_t)vlen), rindex);
        } else {
            char *vbuffer2 = mem_alloc(NULL, vlen + nchars);
            vlen = snprintf(vbuffer2, vlen + nchars, "\"%s\"", v);
            RETURN_VALUE(VALUE_FROM_OBJECT(gravity_string_new(vm, vbuffer2, (uint32_t)vlen, 0)), rindex);
        }
    }
    
    // primitive cases supported by JSON (true, false, null, number)
    char vbuffer[512];
    const char *v = NULL;
    
    if (VALUE_ISA_NULL(value) || (VALUE_ISA_UNDEFINED(value))) v = "null";
    // was %g but we don't like scientific notation nor the missing .0 in case of float number with no decimals
    else if (VALUE_ISA_FLOAT(value)) {snprintf(vbuffer, sizeof(vbuffer), "%f", value.f); v = vbuffer;}
    else if (VALUE_ISA_BOOL(value)) v = (value.n) ? "true" : "false";
    else if (VALUE_ISA_INT(value)) {
        #if GRAVITY_ENABLE_INT64
        snprintf(vbuffer, sizeof(vbuffer), "%" PRId64 "", value.n);
        #else
        snprintf(vbuffer, sizeof(vbuffer), "%d", value.n);
        #endif
        v = vbuffer;
    }
    if (v) RETURN_VALUE(VALUE_FROM_CSTRING(vm, v), rindex);
    
    // more complex object case (list, map, class, closure, instance/object)
    json_t *json = json_new();
    json_set_option(json, json_opt_no_maptype);
    json_set_option(json, json_opt_no_undef);
    json_set_option(json, json_opt_prettify);
    gravity_value_serialize(NULL, value, json);
    
    size_t len = 0;
    const char *jbuffer = json_buffer(json, &len);
    const char *buffer = string_ndup(jbuffer, len);
    
    gravity_string_t *s = gravity_string_new(vm, (char *)buffer, (uint32_t)len, 0);
    json_free(json);
    
    RETURN_VALUE(VALUE_FROM_OBJECT(s), rindex);
}